

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O2

void __thiscall
Js::InterpreterStackFrame::
OP_ProfileCallCommon<Js::OpLayoutDynamicProfile<Js::OpLayoutT_CallIExtendedFlagsWithICIndex<Js::LayoutSizePolicy<(Js::LayoutSize)1>>>__unaligned>
          (InterpreterStackFrame *this,
          OpLayoutDynamicProfile<Js::OpLayoutT_CallIExtendedFlagsWithICIndex<Js::LayoutSizePolicy<(Js::LayoutSize)1>_>_>
          *playout,RecyclableObject *function,uint flags,ProfileId profileId,
          InlineCacheIndex inlineCacheIndex,AuxArray<unsigned_int> *spreadIndices)

{
  ushort callApplyCallSiteNum;
  FunctionBody *this_00;
  code *pcVar1;
  bool bVar2;
  ProfileId PVar3;
  JavascriptFunction *pJVar4;
  DynamicProfileInfo *this_01;
  Var object;
  unsigned_short *puVar5;
  undefined4 *puVar6;
  uint localRegisterID;
  JavascriptFunction *local_40;
  FunctionInfo *local_38;
  
  bVar2 = VarIs<Js::JavascriptFunction>((Var)**(undefined8 **)(this + 0x28));
  if (bVar2) {
    local_40 = UnsafeVarTo<Js::JavascriptFunction>((Var)**(undefined8 **)(this + 0x28));
  }
  else {
    local_40 = (JavascriptFunction *)0x0;
  }
  this_00 = *(FunctionBody **)(this + 0x88);
  if (((function->type).ptr)->typeId == TypeIds_Function) {
    pJVar4 = VarTo<Js::JavascriptFunction,Js::RecyclableObject>(function);
    local_38 = (pJVar4->functionInfo).ptr;
  }
  else {
    local_38 = (FunctionInfo *)0x0;
  }
  this_01 = FunctionBody::GetDynamicProfileInfo(this_00);
  OP_CallCommon<Js::OpLayoutDynamicProfile<Js::OpLayoutT_CallIExtendedFlagsWithICIndex<Js::LayoutSizePolicy<(Js::LayoutSize)1>>>__unaligned>
            (this,playout,function,flags,spreadIndices);
  if (local_38 == (FunctionInfo *)0x0) {
    function = (RecyclableObject *)0x0;
  }
  DynamicProfileInfo::RecordCallSiteInfo
            (this_01,this_00,profileId,local_38,(JavascriptFunction *)function,
             (uint)(playout->
                   super_OpLayoutT_CallIExtendedFlagsWithICIndex<Js::LayoutSizePolicy<(Js::LayoutSize)1>_>
                   ).
                   super_OpLayoutT_CallIExtendedWithICIndex<Js::LayoutSizePolicy<(Js::LayoutSize)1>_>
                   .super_OpLayoutT_CallIExtended<Js::LayoutSizePolicy<(Js::LayoutSize)1>_>.
                   super_OpLayoutT_CallI<Js::LayoutSizePolicy<(Js::LayoutSize)1>_>.ArgCount,
             (bool)((byte)flags & 1),inlineCacheIndex);
  if ((local_38 != (FunctionInfo *)0x0) &&
     ((local_38->functionBodyImpl).ptr == (FunctionProxy *)0x0)) {
    bVar2 = FunctionInfo::IsBuiltInApplyFunction(local_38);
    if (bVar2) {
      if (local_40 == (JavascriptFunction *)0x0) goto LAB_00974549;
    }
    else {
      bVar2 = FunctionInfo::IsBuiltInCallFunction(local_38);
      if (local_40 == (JavascriptFunction *)0x0 || !bVar2) goto LAB_00974549;
    }
    puVar5 = FunctionProxy::GetAuxPtr<(Js::FunctionProxy::AuxPointerType)27,unsigned_short*>
                       (*(FunctionProxy **)(this + 0x88));
    if (puVar5 != (unsigned_short *)0x0) {
      callApplyCallSiteNum = puVar5[profileId];
      PVar3 = FunctionBody::GetProfiledCallApplyCallSiteCount(this_00);
      if (callApplyCallSiteNum < PVar3) {
        DynamicProfileInfo::RecordCallApplyTargetInfo
                  (this_01,this_00,callApplyCallSiteNum,(local_40->functionInfo).ptr,local_40);
      }
      else if (callApplyCallSiteNum != 0xffff) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar6 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                    ,0xfc5,"(callApplyCallSiteId == Js::Constants::NoProfileId)",
                                    "callApplyCallSiteId == Js::Constants::NoProfileId");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar6 = 0;
      }
    }
  }
LAB_00974549:
  localRegisterID =
       (uint)(playout->
             super_OpLayoutT_CallIExtendedFlagsWithICIndex<Js::LayoutSizePolicy<(Js::LayoutSize)1>_>
             ).super_OpLayoutT_CallIExtendedWithICIndex<Js::LayoutSizePolicy<(Js::LayoutSize)1>_>.
             super_OpLayoutT_CallIExtended<Js::LayoutSizePolicy<(Js::LayoutSize)1>_>.
             super_OpLayoutT_CallI<Js::LayoutSizePolicy<(Js::LayoutSize)1>_>.Return;
  if (localRegisterID == 0xffffffff) {
    return;
  }
  object = GetReg<unsigned_int>(this,localRegisterID);
  DynamicProfileInfo::RecordReturnTypeOnCallSiteInfo(this_01,this_00,profileId,object);
  return;
}

Assistant:

void InterpreterStackFrame::OP_ProfileCallCommon(const unaligned T * playout, RecyclableObject * function, unsigned flags, ProfileId profileId, InlineCacheIndex inlineCacheIndex, const Js::AuxArray<uint32> *spreadIndices)
    {
        JavascriptFunction * targetFunction = VarIs<JavascriptFunction>(m_outParams[0]) ? UnsafeVarTo<JavascriptFunction>(m_outParams[0]) : nullptr;
        FunctionBody* functionBody = this->m_functionBody;
        FunctionInfo* functionInfo = function->GetTypeId() == TypeIds_Function ?
            VarTo<JavascriptFunction>(function)->GetFunctionInfo() : nullptr;
        DynamicProfileInfo* dynamicProfileInfo = functionBody->GetDynamicProfileInfo();
        bool isConstructorCall = (CallFlags_New & flags) == CallFlags_New;


        OP_CallCommon<T>(playout, function, flags, spreadIndices);


        // Profile call site

        dynamicProfileInfo->RecordCallSiteInfo(functionBody, profileId, functionInfo, functionInfo ? static_cast<JavascriptFunction*>(function) : nullptr, playout->ArgCount, isConstructorCall, inlineCacheIndex);

        if (functionInfo && !functionInfo->HasBody())
        {
            if ((functionInfo->IsBuiltInApplyFunction() || functionInfo->IsBuiltInCallFunction()) && targetFunction)
            {
                Js::ProfileId* callSiteToCallApplyCallSiteMap = this->m_functionBody->GetCallSiteToCallApplyCallSiteArray();
                if (callSiteToCallApplyCallSiteMap)
                {
                    Js::ProfileId callApplyCallSiteId = callSiteToCallApplyCallSiteMap[profileId];
                    if (callApplyCallSiteId < functionBody->GetProfiledCallApplyCallSiteCount())
                    {
                        dynamicProfileInfo->RecordCallApplyTargetInfo(functionBody, callApplyCallSiteId, targetFunction->GetFunctionInfo(), targetFunction);
                    }
                    else
                    {
                        Assert(callApplyCallSiteId == Js::Constants::NoProfileId);
                    }
                }
            }
        }

        if (playout->Return != Js::Constants::NoRegister)
        {
            dynamicProfileInfo->RecordReturnTypeOnCallSiteInfo(functionBody, profileId, GetReg((RegSlot)playout->Return));
        }
    }